

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_set_scanner_error
              (yaml_parser_t *parser,char *context,yaml_mark_t context_mark,char *problem)

{
  char *problem_local;
  char *context_local;
  yaml_parser_t *parser_local;
  
  parser->error = YAML_SCANNER_ERROR;
  parser->context = context;
  (parser->context_mark).index = context_mark.index;
  (parser->context_mark).line = context_mark.line;
  (parser->context_mark).column = context_mark.column;
  parser->problem = problem;
  (parser->problem_mark).index = (parser->mark).index;
  (parser->problem_mark).line = (parser->mark).line;
  (parser->problem_mark).column = (parser->mark).column;
  return 0;
}

Assistant:

static int
yaml_parser_set_scanner_error(yaml_parser_t *parser, const char *context,
        yaml_mark_t context_mark, const char *problem)
{
    parser->error = YAML_SCANNER_ERROR;
    parser->context = context;
    parser->context_mark = context_mark;
    parser->problem = problem;
    parser->problem_mark = parser->mark;

    return 0;
}